

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

void Imf_3_4::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int in_R8D;
  undefined8 *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  LevelRoundingMode in_stack_ffffffffffffffdc;
  
  iVar3 = anon_unknown_12::calculateNumXLevels
                    ((TileDescription *)CONCAT44(minY,maxY),numXTiles._4_4_,(int)numXTiles,
                     unaff_retaddr_00,unaff_retaddr);
  *(int *)CONCAT44(minY,maxY) = iVar3;
  iVar3 = anon_unknown_12::calculateNumYLevels
                    ((TileDescription *)CONCAT44(minY,maxY),numXTiles._4_4_,(int)numXTiles,
                     unaff_retaddr_00,unaff_retaddr);
  *(int *)CONCAT44(minX,maxX) = iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)CONCAT44(minY,maxY);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_R9 = pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)CONCAT44(minX,maxX);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  *numXTiles = piVar6;
  anon_unknown_12::calculateNumTiles
            ((int *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
             in_stack_ffffffffffffffdc);
  anon_unknown_12::calculateNumTiles
            ((int *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
             in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void
precalculateTileInfo (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int*&                  numXTiles,
    int*&                  numYTiles,
    int&                   numXLevels,
    int&                   numYLevels)
{
    numXLevels = calculateNumXLevels (tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels (tileDesc, minX, maxX, minY, maxY);

    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (
        numXTiles,
        numXLevels,
        minX,
        maxX,
        tileDesc.xSize,
        tileDesc.roundingMode);

    calculateNumTiles (
        numYTiles,
        numYLevels,
        minY,
        maxY,
        tileDesc.ySize,
        tileDesc.roundingMode);
}